

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * read_input(string *input_filename)

{
  undefined8 in_RSI;
  string *in_RDI;
  string in;
  ifstream input;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  string *this;
  allocator<char> local_269 [17];
  allocator<char> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffdb8;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffdc8;
  undefined1 local_218 [520];
  undefined8 local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,local_10,8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)this,(istream_type *)in_RDI);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffda8);
  std::allocator<char>::~allocator(local_269);
  std::__cxx11::string::string((string *)in_RDI,(string *)&stack0xfffffffffffffdb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
  std::ifstream::~ifstream(local_218);
  return this;
}

Assistant:

string read_input(std::string& input_filename) {
  ifstream input;
  input.open(input_filename);
  auto in = std::string(istreambuf_iterator<char>(input),
                        istreambuf_iterator<char>());
  return std::move(in);
}